

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::anon_unknown_0::FileContainsExtensions
               (FileDescriptor *file)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (*(int *)(file + 0x3c) < 1) {
    uVar1 = *(uint *)(file + 0x2c);
    lVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar3 = 0;
    do {
      if (uVar5 == uVar3) {
        return (long)uVar3 < (long)(int)uVar1;
      }
      bVar2 = MessageContainsExtensions((Descriptor *)(*(long *)(file + 0x58) + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x88;
    } while (!bVar2);
  }
  return true;
}

Assistant:

bool FileContainsExtensions(const FileDescriptor* file) {
  if (file->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageContainsExtensions(file->message_type(i))) {
      return true;
    }
  }
  return false;
}